

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<false>_>::output_rhythm_ch6
          (fm_channel<ymfm::opn_registers_base<false>_> *this,output_data *output,uint32_t rshift,
          int32_t clipmax)

{
  fm_operator<ymfm::opn_registers_base<false>_> *pfVar1;
  uint32_t am_offset_00;
  uint32_t uVar2;
  int32_t iVar3;
  int local_4c;
  int32_t result;
  int32_t opout1;
  uint32_t feedback;
  int32_t opmod;
  uint32_t am_offset;
  int32_t clipmax_local;
  uint32_t rshift_local;
  output_data *output_local;
  fm_channel<ymfm::opn_registers_base<false>_> *this_local;
  
  am_offset_00 = opn_registers_base<false>::lfo_am_offset(this->m_regs,this->m_choffs);
  opout1 = 0;
  uVar2 = opn_registers_base<false>::ch_feedback(this->m_regs,this->m_choffs);
  if (uVar2 != 0) {
    opout1 = (int)this->m_feedback[0] + (int)this->m_feedback[1] >> (10U - (char)uVar2 & 0x1f);
  }
  pfVar1 = this->m_op[0];
  uVar2 = fm_operator<ymfm::opn_registers_base<false>_>::phase(this->m_op[0]);
  iVar3 = fm_operator<ymfm::opn_registers_base<false>_>::compute_volume
                    (pfVar1,uVar2 + opout1,am_offset_00);
  this->m_feedback_in = (short)iVar3;
  uVar2 = opn_registers_base<false>::ch_algorithm(this->m_regs,this->m_choffs);
  uVar2 = bitfield(uVar2,0,1);
  if (uVar2 == 0) {
    local_4c = (int)(short)iVar3 >> 1;
  }
  else {
    local_4c = 0;
  }
  pfVar1 = this->m_op[1];
  uVar2 = fm_operator<ymfm::opn_registers_base<false>_>::phase(this->m_op[1]);
  iVar3 = fm_operator<ymfm::opn_registers_base<false>_>::compute_volume
                    (pfVar1,uVar2 + local_4c,am_offset_00);
  add_to_output(this,this->m_choffs,output,(iVar3 >> ((byte)rshift & 0x1f)) << 1);
  return;
}

Assistant:

void fm_channel<RegisterType>::output_rhythm_ch6(output_data &output, uint32_t rshift, int32_t clipmax) const
{
	(void)clipmax;
	// AM amount is the same across all operators; compute it once
	uint32_t am_offset = m_regs.lfo_am_offset(m_choffs);

	// Bass Drum: this uses operators 12 and 15 (i.e., channel 6)
	// in an almost-normal way, except that if the algorithm is 1,
	// the first operator is ignored instead of added in

	// operator 1 has optional self-feedback
	int32_t opmod = 0;
	uint32_t feedback = m_regs.ch_feedback(m_choffs);
	if (feedback != 0)
		opmod = (m_feedback[0] + m_feedback[1]) >> (10 - feedback);

	// compute the 14-bit volume/value of operator 1 and update the feedback
	int32_t opout1 = m_feedback_in = m_op[0]->compute_volume(m_op[0]->phase() + opmod, am_offset);

	// compute the 14-bit volume/value of operator 2, which is the result
	opmod = bitfield(m_regs.ch_algorithm(m_choffs), 0) ? 0 : (opout1 >> 1);
	int32_t result = m_op[1]->compute_volume(m_op[1]->phase() + opmod, am_offset) >> rshift;

	// add to the output
	add_to_output(m_choffs, output, result * 2);
}